

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

nghttp2_stream * nghttp2_session_get_stream(nghttp2_session *session,int32_t stream_id)

{
  nghttp2_stream *pnVar1;
  
  pnVar1 = (nghttp2_stream *)nghttp2_map_find(&session->streams,stream_id);
  if ((pnVar1 == (nghttp2_stream *)0x0) || ((pnVar1->flags & 2) != 0)) {
    pnVar1 = (nghttp2_stream *)0x0;
  }
  else if (pnVar1->state == NGHTTP2_STREAM_IDLE) {
    pnVar1 = (nghttp2_stream *)0x0;
  }
  return pnVar1;
}

Assistant:

nghttp2_stream *nghttp2_session_get_stream(nghttp2_session *session,
                                           int32_t stream_id) {
  nghttp2_stream *stream;

  stream = (nghttp2_stream *)nghttp2_map_find(&session->streams, stream_id);

  if (stream == NULL || (stream->flags & NGHTTP2_STREAM_FLAG_CLOSED) ||
      stream->state == NGHTTP2_STREAM_IDLE) {
    return NULL;
  }

  return stream;
}